

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O1

void assert_run_work(uv_loop_t *loop)

{
  uint uVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_work_t work_req;
  uv_work_t uStack_88;
  
  if (work_cb_count == 0) {
    if (after_work_cb_count != 0) goto LAB_0014d5ee;
    uVar1 = getpid();
    printf("Queue in %d\n",(ulong)uVar1);
    puVar3 = loop;
    iVar2 = uv_queue_work(loop,&uStack_88,work_cb,after_work_cb);
    if (iVar2 != 0) goto LAB_0014d5f3;
    getpid();
    printf("Running in %d\n");
    uv_run(loop,UV_RUN_DEFAULT);
    if (work_cb_count == 1) {
      if (after_work_cb_count == 1) {
        work_cb_count = 0;
        after_work_cb_count = 0;
        return;
      }
      goto LAB_0014d5fd;
    }
  }
  else {
    assert_run_work_cold_1();
LAB_0014d5ee:
    assert_run_work_cold_2();
    puVar3 = loop;
LAB_0014d5f3:
    loop = puVar3;
    assert_run_work_cold_3();
  }
  assert_run_work_cold_4();
LAB_0014d5fd:
  assert_run_work_cold_5();
  timer_cb_called = timer_cb_called + 1;
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return;
}

Assistant:

static void assert_run_work(uv_loop_t* const loop) {
  uv_work_t work_req;
  int r;

  ASSERT(work_cb_count == 0);
  ASSERT(after_work_cb_count == 0);
  printf("Queue in %d\n", getpid());
  r = uv_queue_work(loop, &work_req, work_cb, after_work_cb);
  ASSERT(r == 0);
  printf("Running in %d\n", getpid());
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(work_cb_count == 1);
  ASSERT(after_work_cb_count == 1);

  /* cleanup  */
  work_cb_count = 0;
  after_work_cb_count = 0;
}